

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall
kws::Parser::IsBetweenQuoteChar
          (Parser *this,size_t pos,bool withComments,string *buffer,char quoteChar)

{
  bool bVar1;
  size_t pos_00;
  size_t pos_01;
  uint uVar2;
  char cVar3;
  Parser *pPVar4;
  string stream;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,(string *)buffer);
  if ((buffer->_M_string_length == 0) &&
     (std::__cxx11::string::_M_assign((string *)&stack0xffffffffffffffb0), withComments)) {
    std::__cxx11::string::_M_assign((string *)&stack0xffffffffffffffb0);
  }
  if (pos != 0xffffffffffffffff) {
    uVar2 = (uint)quoteChar;
    do {
      pPVar4 = (Parser *)&stack0xffffffffffffffb0;
      pos_00 = std::__cxx11::string::find((char)(Parser *)&stack0xffffffffffffffb0,(ulong)uVar2);
      if (pos_00 == 0xffffffffffffffff) break;
      bVar1 = IsValidQuote(pPVar4,(string *)&stack0xffffffffffffffb0,pos_00);
    } while (!bVar1);
    do {
      pPVar4 = (Parser *)&stack0xffffffffffffffb0;
      pos_01 = std::__cxx11::string::find((char)pPVar4,(ulong)uVar2);
      if (pos_01 == 0xffffffffffffffff) break;
      bVar1 = IsValidQuote(pPVar4,(string *)&stack0xffffffffffffffb0,pos_01);
    } while (!bVar1);
    do {
      bVar1 = pos_00 < pos_01 && pos_01 != 0xffffffffffffffff;
      if ((pos_00 >= pos_01 || pos_01 == 0xffffffffffffffff) || (pos_00 < pos && pos < pos_01))
      goto LAB_0011dbbc;
      do {
        cVar3 = (char)(Parser *)&stack0xffffffffffffffb0;
        pPVar4 = (Parser *)&stack0xffffffffffffffb0;
        pos_00 = std::__cxx11::string::find(cVar3,(ulong)uVar2);
        if (pos_00 == 0xffffffffffffffff) break;
        bVar1 = IsValidQuote(pPVar4,(string *)&stack0xffffffffffffffb0,pos_00);
      } while (!bVar1);
      do {
        pPVar4 = (Parser *)&stack0xffffffffffffffb0;
        pos_01 = std::__cxx11::string::find(cVar3,(ulong)uVar2);
        if (pos_01 == 0xffffffffffffffff) break;
        bVar1 = IsValidQuote(pPVar4,(string *)&stack0xffffffffffffffb0,pos_01);
      } while (!bVar1);
    } while( true );
  }
  bVar1 = false;
LAB_0011dbbc:
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return bVar1;
}

Assistant:

bool Parser::IsBetweenQuoteChar(size_t pos,bool withComments,std::string buffer, char quoteChar) const
{
  std::string stream = buffer;

  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  // We don't want to check for \" otherwise it fails
  size_t b0 = stream.find(quoteChar,0);
  while((b0!=std::string::npos) && !this->IsValidQuote(stream,b0))
    {
    b0 = stream.find(quoteChar,b0+1);
    }

  size_t b1 = stream.find(quoteChar,b0+1);
  while((b1!=std::string::npos) && !this->IsValidQuote(stream,b1))
    {
    b1 = stream.find(quoteChar,b1+1);
    }

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(quoteChar,b1+1);
    while((b0!=std::string::npos) && !this->IsValidQuote(stream,b0))
      {
      b0 = stream.find(quoteChar,b0+1);
      }

    b1 = stream.find(quoteChar,b0+1);
    while((b1!=std::string::npos) && !this->IsValidQuote(stream,b1))
      {
      b1 = stream.find(quoteChar,b1+1);
      }
    }
  return false;
}